

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedPipelineRenderer.cpp
# Opt level: O2

void __thiscall
irr::video::COpenGL3MaterialBaseCB::OnSetMaterial(COpenGL3MaterialBaseCB *this,SMaterial *material)

{
  uint uVar1;
  SColorf local_28;
  
  this->LightEnable = (bool)((byte)material->field_0xb0 >> 3 & 1);
  SColorf::SColorf(&local_28,(SColor)(material->AmbientColor).color);
  (this->MaterialAmbient).r = local_28.r;
  (this->MaterialAmbient).g = local_28.g;
  (this->MaterialAmbient).b = local_28.b;
  (this->MaterialAmbient).a = local_28.a;
  SColorf::SColorf(&local_28,(SColor)(material->DiffuseColor).color);
  (this->MaterialDiffuse).r = local_28.r;
  (this->MaterialDiffuse).g = local_28.g;
  (this->MaterialDiffuse).b = local_28.b;
  (this->MaterialDiffuse).a = local_28.a;
  SColorf::SColorf(&local_28,(SColor)(material->EmissiveColor).color);
  (this->MaterialEmissive).r = local_28.r;
  (this->MaterialEmissive).g = local_28.g;
  (this->MaterialEmissive).b = local_28.b;
  (this->MaterialEmissive).a = local_28.a;
  SColorf::SColorf(&local_28,(SColor)(material->SpecularColor).color);
  (this->MaterialSpecular).r = local_28.r;
  (this->MaterialSpecular).g = local_28.g;
  (this->MaterialSpecular).b = local_28.b;
  (this->MaterialSpecular).a = local_28.a;
  this->MaterialShininess = material->Shininess;
  this->FogEnable = *(uint *)&material->field_0xb0 >> 8 & 1;
  uVar1 = -(uint)(0.0 < (float)material->Thickness);
  this->Thickness = (f32)(~uVar1 & 0x3f800000 | (uint)material->Thickness & uVar1);
  return;
}

Assistant:

void COpenGL3MaterialBaseCB::OnSetMaterial(const SMaterial &material)
{
	LightEnable = material.Lighting;
	MaterialAmbient = SColorf(material.AmbientColor);
	MaterialDiffuse = SColorf(material.DiffuseColor);
	MaterialEmissive = SColorf(material.EmissiveColor);
	MaterialSpecular = SColorf(material.SpecularColor);
	MaterialShininess = material.Shininess;

	FogEnable = material.FogEnable ? 1 : 0;

	Thickness = (material.Thickness > 0.f) ? material.Thickness : 1.f;
}